

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

Matcher<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&> * __thiscall
testing::internal::ElementsAreMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>
           *__return_storage_ptr__,ElementsAreMatcher *this)

{
  ElementsAreMatcherImpl<std::vector<unsigned_long,std::allocator<unsigned_long>>const&> *this_00;
  undefined4 *puVar1;
  MatcherVec matchers;
  IterateOverTuple<std::tuple<int,_int,_int,_int,_int,_int,_int,_int>,_8UL> local_29;
  vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
  local_28;
  
  local_28.
  super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (Matcher<const_unsigned_long_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matcher<const_unsigned_long_&> *)0x0;
  local_28.
  super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
  ::reserve(&local_28,8);
  TransformTupleValuesHelper<std::tuple<int,_int,_int,_int,_int,_int,_int,_int>,_testing::internal::CastAndAppendTransform<const_unsigned_long_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>_>_>
  ::IterateOverTuple<std::tuple<int,_int,_int,_int,_int,_int,_int,_int>,_8UL>::operator()
            (&local_29,this,&local_28);
  this_00 = (ElementsAreMatcherImpl<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>
             *)operator_new(0x20);
  ElementsAreMatcherImpl<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>::
  ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<unsigned_long_const&>*,std::vector<testing::Matcher<unsigned_long_const&>,std::allocator<testing::Matcher<unsigned_long_const&>>>>>
            (this_00,(__normal_iterator<testing::Matcher<const_unsigned_long_&>_*,_std::vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>_>
                      )local_28.
                       super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<testing::Matcher<const_unsigned_long_&>_*,_std::vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>_>
              )local_28.
               super__Vector_base<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bc428;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>).vtable_ =
       (VTable *)0x0;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>).buffer_.ptr
       = (void *)0x0;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>).vtable_ =
       (VTable *)
       MatcherBase<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>::
       GetVTable<testing::internal::MatcherBase<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>::ValuePolicy<testing::MatcherInterface<std::vector<unsigned_long,std::allocator<unsigned_long>>const&>const*,true>>()
       ::kVTable;
  puVar1 = (undefined4 *)operator_new(0x10);
  *puVar1 = 1;
  *(ElementsAreMatcherImpl<std::vector<unsigned_long,std::allocator<unsigned_long>>const&> **)
   (puVar1 + 2) = this_00;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>).buffer_.ptr
       = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001bc3b8;
  std::
  vector<testing::Matcher<const_unsigned_long_&>,_std::allocator<testing::Matcher<const_unsigned_long_&>_>_>
  ::~vector(&local_28);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    static_assert(
        !IsHashTable<GTEST_REMOVE_REFERENCE_AND_CONST_(Container)>::value ||
            ::std::tuple_size<MatcherTuple>::value < 2,
        "use UnorderedElementsAre with hash tables");

    typedef GTEST_REMOVE_REFERENCE_AND_CONST_(Container) RawContainer;
    typedef typename internal::StlContainerView<RawContainer>::type View;
    typedef typename View::value_type Element;
    typedef ::std::vector<Matcher<const Element&>> MatcherVec;
    MatcherVec matchers;
    matchers.reserve(::std::tuple_size<MatcherTuple>::value);
    TransformTupleValues(CastAndAppendTransform<const Element&>(), matchers_,
                         ::std::back_inserter(matchers));
    return Matcher<Container>(new ElementsAreMatcherImpl<const Container&>(
        matchers.begin(), matchers.end()));
  }